

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outer_join_marker.cpp
# Opt level: O3

void __thiscall duckdb::OuterJoinMarker::Initialize(OuterJoinMarker *this,idx_t count_p)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  byte bVar3;
  
  if (this->enabled == true) {
    this->count = count_p;
    _Var2._M_head_impl = (bool *)operator_new__(count_p);
    _Var1._M_head_impl =
         (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
    super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var2._M_head_impl;
    bVar3 = 1;
    if (_Var1._M_head_impl != (bool *)0x0) {
      operator_delete__(_Var1._M_head_impl);
      bVar3 = this->enabled;
    }
    if ((bVar3 & 1) != 0) {
      switchD_012e5a64::default
                ((this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                 super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,this->count);
      return;
    }
  }
  return;
}

Assistant:

void OuterJoinMarker::Initialize(idx_t count_p) {
	if (!enabled) {
		return;
	}
	this->count = count_p;
	found_match = make_unsafe_uniq_array_uninitialized<bool>(count);
	Reset();
}